

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O3

int Llb_Nonlin4Quantify1(Llb_Mgr_t_conflict *p,Llb_Prt_t *pPart)

{
  DdNode *f;
  Llb_Var_t *pVar;
  int *piVar1;
  Llb_Prt_t *pLVar2;
  int iVar3;
  DdNode *n;
  DdNode *n_00;
  uint *__ptr;
  Vec_Int_t *pVVar4;
  void *pvVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  bool bVar12;
  ulong local_38;
  
  n = Llb_Nonlin4CreateCube1(p,pPart);
  Cudd_Ref(n);
  f = pPart->bFunc;
  n_00 = Cudd_bddExistAbstract(p->dd,f,n);
  pPart->bFunc = n_00;
  Cudd_Ref(n_00);
  Cudd_RecursiveDeref(p->dd,f);
  Cudd_RecursiveDeref(p->dd,n);
  __ptr = (uint *)calloc(1,0x10);
  iVar3 = Cudd_DagSize(pPart->bFunc);
  Extra_SupportArray(p->dd,pPart->bFunc,p->pSupp);
  pVVar4 = pPart->vVars;
  if (pVVar4->nSize < 1) {
    uVar11 = 0;
  }
  else {
    local_38 = 0;
    uVar11 = 0;
    lVar9 = 0;
    do {
      pVar = p->pVars[pVVar4->pArray[lVar9]];
      pVVar4 = pVar->vParts;
      if (p->pSupp[pVar->iVar] == 0) {
        iVar7 = pVVar4->nSize;
        if ((long)iVar7 < 1) {
          if (iVar7 != 0) {
            __assert_fail("i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x3c1,"int Vec_IntRemove(Vec_Int_t *, int)");
          }
LAB_007e420d:
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb4Image.c"
                        ,0x120,"int Llb_Nonlin4Quantify1(Llb_Mgr_t *, Llb_Prt_t *)");
        }
        piVar1 = pVVar4->pArray;
        lVar8 = 1;
        while (piVar1[lVar8 + -1] != pPart->iPart) {
          bVar12 = lVar8 == iVar7;
          lVar8 = lVar8 + 1;
          if (bVar12) goto LAB_007e420d;
        }
        if ((int)lVar8 < iVar7) {
          do {
            piVar1[lVar8 + -1] = piVar1[lVar8];
            lVar8 = lVar8 + 1;
            iVar7 = pVVar4->nSize;
          } while ((int)lVar8 < iVar7);
        }
        pVVar4->nSize = iVar7 + -1;
        pVar->nScore = pVar->nScore - pPart->nSize;
        if (iVar7 == 1) {
          Llb_Nonlin4RemoveVar(p,pVar);
        }
        else if (iVar7 == 2) {
          pLVar2 = p->pParts[*piVar1];
          if (0 < (int)uVar11) {
            uVar10 = 0;
            do {
              if (*(Llb_Prt_t **)(*(long *)(__ptr + 2) + uVar10 * 8) == pLVar2) goto LAB_007e3fc2;
              uVar10 = uVar10 + 1;
            } while (uVar11 != uVar10);
          }
          uVar6 = (uint)local_38;
          if (uVar11 == uVar6) {
            if ((int)uVar6 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar5 = malloc(0x80);
              }
              else {
                pvVar5 = realloc(*(void **)(__ptr + 2),0x80);
              }
              *(void **)(__ptr + 2) = pvVar5;
              *__ptr = 0x10;
              local_38 = 0x10;
            }
            else {
              local_38 = (ulong)(uVar6 * 2);
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar5 = malloc(local_38 * 8);
              }
              else {
                pvVar5 = realloc(*(void **)(__ptr + 2),local_38 * 8);
              }
              *(void **)(__ptr + 2) = pvVar5;
              *__ptr = uVar6 * 2;
            }
          }
          else {
            pvVar5 = *(void **)(__ptr + 2);
          }
          lVar8 = (long)(int)uVar11;
          uVar11 = uVar11 + 1;
          __ptr[1] = uVar11;
          *(Llb_Prt_t **)((long)pvVar5 + lVar8 * 8) = pLVar2;
        }
      }
      else {
        if (pVVar4->nSize < 2) {
          __assert_fail("Vec_IntSize(pVar->vParts) > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb4Image.c"
                        ,0x11a,"int Llb_Nonlin4Quantify1(Llb_Mgr_t *, Llb_Prt_t *)");
        }
        pVar->nScore = pVar->nScore + (iVar3 - pPart->nSize);
      }
LAB_007e3fc2:
      lVar9 = lVar9 + 1;
      pVVar4 = pPart->vVars;
    } while (lVar9 < pVVar4->nSize);
  }
  pPart->nSize = iVar3;
  pVVar4->nSize = 0;
  iVar3 = p->nVars;
  if (0 < iVar3) {
    lVar9 = 0;
    do {
      if (p->pSupp[lVar9] != 0) {
        if (p->vVars2Q->nSize <= lVar9) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (p->vVars2Q->pArray[lVar9] != 0) {
          Vec_IntPush(pPart->vVars,(int)lVar9);
          iVar3 = p->nVars;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar3);
  }
  pvVar5 = *(void **)(__ptr + 2);
  if ((int)uVar11 < 1) {
    if (pvVar5 == (void *)0x0) goto LAB_007e41b2;
  }
  else {
    uVar10 = 0;
    do {
      Llb_Nonlin4Quantify1(p,*(Llb_Prt_t **)((long)pvVar5 + uVar10 * 8));
      uVar10 = uVar10 + 1;
    } while (uVar11 != uVar10);
  }
  free(pvVar5);
LAB_007e41b2:
  free(__ptr);
  return 0;
}

Assistant:

int Llb_Nonlin4Quantify1( Llb_Mgr_t * p, Llb_Prt_t * pPart )
{
    Llb_Var_t * pVar;
    Llb_Prt_t * pTemp;
    Vec_Ptr_t * vSingles;
    DdNode * bCube, * bTemp;
    int i, RetValue, nSizeNew;
    // create cube to be quantified
    bCube = Llb_Nonlin4CreateCube1( p, pPart );   Cudd_Ref( bCube );
//    assert( !Cudd_IsConstant(bCube) );
    // derive new function
    pPart->bFunc = Cudd_bddExistAbstract( p->dd, bTemp = pPart->bFunc, bCube );  Cudd_Ref( pPart->bFunc );
    Cudd_RecursiveDeref( p->dd, bTemp );
    Cudd_RecursiveDeref( p->dd, bCube );
    // get support
    vSingles = Vec_PtrAlloc( 0 );
    nSizeNew = Cudd_DagSize(pPart->bFunc);
    Extra_SupportArray( p->dd, pPart->bFunc, p->pSupp );
    Llb_PartForEachVar( p, pPart, pVar, i )
        if ( p->pSupp[pVar->iVar] )
        {
            assert( Vec_IntSize(pVar->vParts) > 1 );
            pVar->nScore -= pPart->nSize - nSizeNew;
        }
        else
        {
            RetValue = Vec_IntRemove( pVar->vParts, pPart->iPart );
            assert( RetValue );
            pVar->nScore -= pPart->nSize;
            if ( Vec_IntSize(pVar->vParts) == 0 )
                Llb_Nonlin4RemoveVar( p, pVar );
            else if ( Vec_IntSize(pVar->vParts) == 1 )
                Vec_PtrPushUnique( vSingles, Llb_MgrPart(p, Vec_IntEntry(pVar->vParts,0)) );
        }

    // update partition
    pPart->nSize = nSizeNew;
    Vec_IntClear( pPart->vVars );
    for ( i = 0; i < p->nVars; i++ )
        if ( p->pSupp[i] && Vec_IntEntry(p->vVars2Q, i) )
            Vec_IntPush( pPart->vVars, i );
    // remove other variables
    Vec_PtrForEachEntry( Llb_Prt_t *, vSingles, pTemp, i )
        Llb_Nonlin4Quantify1( p, pTemp );
    Vec_PtrFree( vSingles );
    return 0;
}